

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O1

bool uci::parse_command(string *input)

{
  uint *puVar1;
  byte bVar2;
  unique_ptr<options,_std::default_delete<options>_> uVar3;
  size_type sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  istream *piVar9;
  ostream *poVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined4 extraout_var;
  ulong uVar12;
  long *plVar13;
  char *__s;
  byte bVar14;
  Move *m;
  Move *m_00;
  long lVar15;
  byte bVar16;
  undefined8 uVar17;
  byte bVar18;
  _Alloc_hider _Var19;
  Move *pMVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  size_t sVar22;
  undefined1 uVar23;
  float fVar24;
  int numThreads;
  string cmd;
  bool silent;
  Movegen mvs;
  istringstream instream;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  ulong local_590;
  string local_588;
  string local_568;
  string local_548;
  undefined8 local_528;
  undefined8 uStack_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  int local_508;
  bool bStack_504;
  bool bStack_503;
  U8 UStack_502;
  U8 UStack_501;
  ios_base local_4b0 [768];
  long local_1b0 [3];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)input,_S_in);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0._M_string_length = 0;
  local_5d0.field_2._M_local_buf[0] = '\0';
LAB_00125aec:
  do {
    while( true ) {
      puVar1 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
      *puVar1 = *puVar1 | 0x1000;
      piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0);
      sVar4 = local_5d0._M_string_length;
      _Var19._M_p = local_5d0._M_dataplus._M_p;
      uVar23 = ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0;
      if ((bool)uVar23) goto LAB_00126f25;
      local_590 = CONCAT71(local_590._1_7_,uVar23);
      if (local_5d0._M_string_length != 0) {
        sVar22 = 0;
        do {
          iVar7 = tolower((int)_Var19._M_p[sVar22]);
          _Var19._M_p[sVar22] = (char)iVar7;
          sVar22 = sVar22 + 1;
        } while (sVar4 != sVar22);
      }
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"position");
      if ((iVar7 != 0) ||
         (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
         ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0)) break;
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      local_5f0._M_string_length = 0;
      local_5f0.field_2._M_local_buf[0] = '\0';
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"startpos");
      cVar5 = (char)(istringstream *)local_1b0;
      if (iVar7 == 0) {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar5);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1b0,(string *)&local_5f0,cVar5);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_528,(string *)&START_FEN_abi_cxx11_,_S_in);
        position::setup(&uci_pos,(istringstream *)&local_528);
        load_position(&local_5f0);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_528);
        std::ios_base::~ios_base(local_4b0);
      }
      else {
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"");
        while ((piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
               ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0 &&
               (iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_5d0,"moves"), iVar7 != 0))) {
          local_528 = &local_518;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_528,local_5d0._M_dataplus._M_p,
                     local_5d0._M_dataplus._M_p + local_5d0._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528
                     ," ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_5b0,local_528->_M_local_buf,uStack_520);
          if (local_528 != &local_518) {
            operator_delete(local_528,local_518._M_allocated_capacity + 1);
          }
        }
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar5);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1b0,(string *)&local_5f0,cVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_528,"moves ",&local_5f0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_5f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528);
        if (local_528 != &local_518) {
          operator_delete(local_528,local_518._M_allocated_capacity + 1);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_528,(string *)&local_5b0,_S_in);
        position::setup(&uci_pos,(istringstream *)&local_528);
        load_position(&local_5f0);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_528);
        std::ios_base::~ios_base(local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        uVar17 = CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_,
                          local_5f0.field_2._M_local_buf[0]);
        _Var19._M_p = local_5f0._M_dataplus._M_p;
LAB_0012604d:
        operator_delete(_Var19._M_p,uVar17 + 1);
      }
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5d0,"setoption");
    if ((iVar7 == 0) &&
       ((piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
        ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0 &&
        (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
        ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)))) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"hash");
      if (((iVar7 == 0) &&
          (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
          ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
         ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
        iVar7 = atoi(local_5d0._M_dataplus._M_p);
        uVar3 = opts;
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"hashsize","");
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_588,iVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        uVar23 = 1;
        hash_table::resize(&ttable,(long)iVar7);
        goto LAB_00126f25;
      }
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"clear");
      if (((iVar7 == 0) &&
          (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
          ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) &&
         (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_5d0,"hash"), iVar7 == 0)) {
        hash_table::clear(&ttable);
      }
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"threads");
      if (((iVar7 == 0) &&
          (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
          ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0), uVar3 = opts,
         ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
        paVar21 = &local_548.field_2;
        local_548._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"threads","");
        iVar7 = atoi(local_5d0._M_dataplus._M_p);
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_548,iVar7);
        _Var19._M_p = local_548._M_dataplus._M_p;
        goto LAB_00126f0b;
      }
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"multipv");
      if (((iVar7 == 0) &&
          (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
          ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) &&
         (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0), uVar3 = opts,
         ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
        paVar21 = &local_568.field_2;
        local_568._M_dataplus._M_p = (pointer)paVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"multipv","");
        iVar7 = atoi(local_5d0._M_dataplus._M_p);
        options::set<int>((options *)
                          uVar3._M_t.super___uniq_ptr_impl<options,_std::default_delete<options>_>.
                          _M_t.super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>.
                          super__Head_base<0UL,_options_*,_false>._M_head_impl,&local_568,iVar7);
        _Var19._M_p = local_568._M_dataplus._M_p;
LAB_00126f0b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var19._M_p != paVar21) {
          operator_delete(_Var19._M_p,paVar21->_M_allocated_capacity + 1);
        }
        uVar23 = 1;
LAB_00126f25:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,
                          CONCAT71(local_5d0.field_2._M_allocated_capacity._1_7_,
                                   local_5d0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        return (bool)uVar23;
      }
      goto LAB_00125aec;
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5d0,"d");
    if (iVar7 == 0) {
      position::print(&uci_pos);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"position hash key: ",0x13);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fen: ",5);
      position::to_fen_abi_cxx11_((string *)&local_528,&uci_pos);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_528->_M_local_buf,uStack_520);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      uVar17 = local_518._M_allocated_capacity;
      _Var19._M_p = (pointer)local_528;
      if (local_528 != &local_518) goto LAB_0012604d;
      goto LAB_00125aec;
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_5d0,"eval");
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_5d0,"undo");
      if (iVar7 == 0) {
        position::undo_move(&uci_pos,&dbgmove);
      }
      else {
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_5d0,"fdepth");
        if ((iVar7 == 0) &&
           (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
           ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
          uci_pos.params.fixed_depth = atoi(local_5d0._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"fixed depth search: ",0x14);
          poVar10 = (ostream *)
                    std::ostream::operator<<((ostream *)&std::cout,uci_pos.params.fixed_depth);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          goto LAB_0012628c;
        }
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_5d0,"see");
        if ((iVar7 == 0) &&
           (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
           ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
          Movegen::Movegen((Movegen *)&local_528,&uci_pos);
          Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)&local_528);
          local_5b0._M_dataplus._M_p._0_3_ = (Move)0x110000;
          if (0 < (int)local_528) {
            pMVar20 = (Move *)((long)&local_528 + 4);
            lVar15 = 0;
            do {
              bVar6 = position::is_legal(&uci_pos,pMVar20);
              if (bVar6) {
                move_to_string_abi_cxx11_(&local_5f0,(uci *)pMVar20,m);
                if (local_5f0._M_string_length == local_5d0._M_string_length) {
                  if (local_5f0._M_string_length == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar7 = bcmp(local_5f0._M_dataplus._M_p,local_5d0._M_dataplus._M_p,
                                 local_5f0._M_string_length);
                    bVar6 = iVar7 == 0;
                  }
                }
                else {
                  bVar6 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                  operator_delete(local_5f0._M_dataplus._M_p,
                                  CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_,
                                           local_5f0.field_2._M_local_buf[0]) + 1);
                }
                if (bVar6) {
                  local_5b0._M_dataplus._M_p._0_3_ = *pMVar20;
                  break;
                }
              }
              lVar15 = lVar15 + 1;
              pMVar20 = pMVar20 + 1;
            } while (lVar15 < (int)local_528);
          }
          if (local_5b0._M_dataplus._M_p._2_1_ == '\x11') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," (dbg) See : error, illegal move.",0x21);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          else {
            iVar7 = position::see_move(&uci_pos,(Move *)&local_5b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"See score:  ",0xc);
            plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
            std::ostream::put((char)plVar13);
            std::ostream::flush();
          }
        }
        else {
          iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_5d0,"domove");
          if ((iVar7 != 0) ||
             (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
             ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0)) {
            iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_5d0,"debug");
            if (iVar7 == 0) {
              uci_pos.debug_search = (bool)(uci_pos.debug_search ^ 1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"debugging set to: ",0x12);
              poVar10 = std::ostream::_M_insert<bool>(true);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            }
            else {
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_5d0,"isready");
              if (iVar7 != 0) {
                if (((Search::searching & 1) == 0) &&
                   (iVar7 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5d0,"go"), iVar7 == 0)) {
                  local_518._M_allocated_capacity = 0;
                  local_518._8_8_ = 0;
                  local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                  uStack_520 = 0;
                  local_508._0_1_ = '\0';
                  local_508._1_1_ = '\0';
                  local_508._2_1_ = '\0';
                  local_508._3_1_ = '\0';
                  bStack_504 = false;
                  bStack_503 = false;
                  UStack_502 = '\0';
                  UStack_501 = '\0';
                  while (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                        ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
                    iVar7 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5d0,"wtime");
                    if ((iVar7 == 0) &&
                       (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                       ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
                      iVar7 = atoi(local_5d0._M_dataplus._M_p);
                      local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(local_528._4_4_,iVar7);
                    }
                    else {
                      iVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_5d0,"btime");
                      if ((iVar7 == 0) &&
                         (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                         ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
                        iVar7 = atoi(local_5d0._M_dataplus._M_p);
                        local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(iVar7,(int)local_528);
                      }
                      else {
                        iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_5d0,"winc");
                        if ((iVar7 == 0) &&
                           (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                           ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
                          iVar7 = atoi(local_5d0._M_dataplus._M_p);
                          uStack_520 = CONCAT44(uStack_520._4_4_,iVar7);
                        }
                        else {
                          iVar7 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(&local_5d0,"binc");
                          if ((iVar7 == 0) &&
                             (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                             ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)) {
                            iVar7 = atoi(local_5d0._M_dataplus._M_p);
                            uStack_520 = CONCAT44(iVar7,(undefined4)uStack_520);
                          }
                          else {
                            iVar7 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare(&local_5d0,"movestogo");
                            if ((iVar7 == 0) &&
                               (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0),
                               ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0))
                            {
                              iVar7 = atoi(local_5d0._M_dataplus._M_p);
                              local_518._M_allocated_capacity._0_4_ = iVar7;
                            }
                            else {
                              iVar7 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::compare(&local_5d0,"nodes");
                              if ((iVar7 == 0) &&
                                 (piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_5d0
                                                          ),
                                 ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0)
                                 ) {
                                iVar7 = atoi(local_5d0._M_dataplus._M_p);
                                local_518._M_allocated_capacity._4_4_ = iVar7;
                              }
                              else {
                                iVar7 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::compare(&local_5d0,"movetime");
                                if ((iVar7 == 0) &&
                                   (piVar9 = std::operator>>((istream *)local_1b0,
                                                             (string *)&local_5d0),
                                   ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) ==
                                   0)) {
                                  iVar7 = atoi(local_5d0._M_dataplus._M_p);
                                  local_518._8_4_ = iVar7;
                                }
                                else {
                                  iVar7 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::compare(&local_5d0,"mate");
                                  if ((iVar7 == 0) &&
                                     (piVar9 = std::operator>>((istream *)local_1b0,
                                                               (string *)&local_5d0),
                                     ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5)
                                     == 0)) {
                                    iVar7 = atoi(local_5d0._M_dataplus._M_p);
                                    local_518._12_4_ = iVar7;
                                  }
                                  else {
                                    iVar7 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(&local_5d0,"depth");
                                    if ((iVar7 == 0) &&
                                       (piVar9 = std::operator>>((istream *)local_1b0,
                                                                 (string *)&local_5d0),
                                       ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5)
                                       == 0)) {
                                      iVar7 = atoi(local_5d0._M_dataplus._M_p);
                                      local_508 = iVar7;
                                    }
                                    else {
                                      iVar7 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              ::compare(&local_5d0,"infinite");
                                      if (iVar7 == 0) {
                                        iVar7 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                ::compare(&local_5d0,"infinite");
                                        bStack_504 = iVar7 == 0;
                                      }
                                      else {
                                        iVar7 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                ::compare(&local_5d0,"ponder");
                                        if (iVar7 == 0) {
                                          iVar7 = atoi(local_5d0._M_dataplus._M_p);
                                          bStack_503 = iVar7 != 0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  uVar8 = options::value<int>((options *)
                                              opts._M_t.
                                              super___uniq_ptr_impl<options,_std::default_delete<options>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_options_*,_std::default_delete<options>_>
                                              .super__Head_base<0UL,_options_*,_false>._M_head_impl,
                                              "threads");
                  uVar12 = (ulong)uVar8;
                  if ((int)uVar8 < 2) {
                    uVar12 = 1;
                  }
                  local_5f0._M_dataplus._M_p._0_4_ = (int)uVar12;
                  if ((long)SearchThreads.workers.
                            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)SearchThreads.workers.
                            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar12) {
                    Threadpool<Searchthread>::init(&SearchThreads,(EVP_PKEY_CTX *)&local_5f0);
                  }
                  local_5b0._M_dataplus._M_p = local_5b0._M_dataplus._M_p & 0xffffffffffffff00;
                  Threadpool<Workerthread>::
                  enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
                            (&worker,Search::start,&uci_pos,(limits *)&local_528,(bool *)&local_5b0)
                  ;
                }
                else {
                  iVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_5d0,"stop");
                  if (iVar7 == 0) {
                    UCI_SIGNALS.stop = true;
                  }
                  else {
                    iVar7 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5d0,"moves");
                    if (iVar7 == 0) {
                      Movegen::Movegen((Movegen *)&local_528,&uci_pos);
                      Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)&local_528);
                      if (0 < (int)local_528) {
                        pMVar20 = (Move *)((long)&local_528 + 4);
                        lVar15 = 0;
                        do {
                          bVar6 = position::is_legal(&uci_pos,pMVar20);
                          if (bVar6) {
                            move_to_string_abi_cxx11_(&local_5f0,(uci *)pMVar20,m_00);
                            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,local_5f0._M_dataplus._M_p,
                                                 local_5f0._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                              operator_delete(local_5f0._M_dataplus._M_p,
                                              CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_
                                                       ,local_5f0.field_2._M_local_buf[0]) + 1);
                            }
                          }
                          lVar15 = lVar15 + 1;
                          pMVar20 = pMVar20 + 1;
                        } while (lVar15 < (int)local_528);
                      }
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                      std::ostream::put(-0x58);
                      std::ostream::flush();
                      goto LAB_00126ce1;
                    }
                    iVar7 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_5d0,"ucinewgame");
                    if (iVar7 == 0) {
                      hash_table::clear(&ttable);
                      position::clear(&uci_pos);
                    }
                    else {
                      iVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(&local_5d0,"uci");
                      if (iVar7 == 0) {
                        hash_table::clear(&ttable);
                        position::clear(&uci_pos);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"id name haVoc",0xd);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"id author M.Glatzmaier",0x16);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name Threads type spin default 1 min 1 max 1024",0x36);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name Hash type spin default 1024 min 1 max 33554432",0x3a
                                  );
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "option name MultiPV type spin default 1 min 1 max 4",0x33);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"uciok",5);
                        poVar10 = (ostream *)&std::cout;
                      }
                      else {
                        iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_5d0,"exit");
                        if (iVar7 == 0) {
                          uVar23 = (undefined1)local_590;
                          goto LAB_00126f25;
                        }
                        iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&local_5d0,"quit");
                        uVar23 = (undefined1)local_590;
                        if (iVar7 == 0) goto LAB_00126f25;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"unknown command: ",0x11);
                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,local_5d0._M_dataplus._M_p,
                                             local_5d0._M_string_length);
                      }
                      std::endl<char,std::char_traits<char>>(poVar10);
                    }
                  }
                }
                goto LAB_00125aec;
              }
              hash_table::clear(&ttable);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readyok",7);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              poVar10 = (ostream *)&std::cout;
            }
LAB_0012628c:
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            goto LAB_00125aec;
          }
          Movegen::Movegen((Movegen *)&local_528,&uci_pos);
          Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)&local_528);
          if (0 < (int)local_528) {
            lVar15 = 0;
            pMVar20 = (Move *)((long)&local_528 + 4);
            local_590 = 0;
            do {
              bVar6 = position::is_legal(&uci_pos,pMVar20);
              if (bVar6) {
                std::operator+(&local_5f0,SanSquares_abi_cxx11_ + pMVar20->f,
                               SanSquares_abi_cxx11_ + pMVar20->t);
                local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"");
                bVar2 = pMVar20->type;
                if (bVar2 < 4) {
                  bVar18 = 2;
                  bVar16 = 1;
                  bVar14 = 0;
LAB_0012642b:
                  __s = "b";
                  if (bVar2 != bVar18) {
                    __s = "n";
                  }
                  if (bVar2 == bVar16) {
                    __s = "r";
                  }
                  if (bVar2 == bVar14) {
                    __s = "q";
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace(&local_5b0,0,local_5b0._M_string_length,__s,1);
                }
                else if (bVar2 < 8) {
                  bVar18 = 6;
                  bVar16 = 5;
                  bVar14 = 4;
                  goto LAB_0012642b;
                }
                pbVar11 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_5f0,local_5b0._M_dataplus._M_p,local_5b0._M_string_length
                                   );
                if (local_5f0._M_string_length == local_5d0._M_string_length) {
                  if (local_5f0._M_string_length == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar7 = bcmp(local_5f0._M_dataplus._M_p,local_5d0._M_dataplus._M_p,
                                 local_5f0._M_string_length);
                    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var,iVar7);
                    bVar6 = iVar7 == 0;
                  }
                }
                else {
                  bVar6 = false;
                }
                if (bVar6) {
                  dbgmove.f = pMVar20->f;
                  dbgmove.type = pMVar20->type;
                  dbgmove.t = pMVar20->t;
                  local_590 = CONCAT71((int7)((ulong)pbVar11 >> 8),1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
                  operator_delete(local_5b0._M_dataplus._M_p,
                                  local_5b0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                  operator_delete(local_5f0._M_dataplus._M_p,
                                  CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_,
                                           local_5f0.field_2._M_local_buf[0]) + 1);
                }
                if (bVar6) break;
              }
              lVar15 = lVar15 + 1;
              pMVar20 = pMVar20 + 1;
            } while (lVar15 < (int)local_528);
            if ((local_590 & 1) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"doing mv ",9);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
              position::do_move(&uci_pos,&dbgmove);
              goto LAB_00126ce1;
            }
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_5d0._M_dataplus._M_p,
                               local_5d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not a legal move",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
LAB_00126ce1:
        Movegen::~Movegen((Movegen *)&local_528);
      }
      goto LAB_00125aec;
    }
    position::print(&uci_pos);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"position hash key: ",0x13);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"evaluation: ",0xc);
    local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_528._4_4_,0xbf800000);
    fVar24 = eval::evaluate(&uci_pos,*SearchThreads.workers.
                                      super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(float *)&local_528)
    ;
    poVar10 = std::ostream::_M_insert<double>((double)fVar24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  } while( true );
}

Assistant:

bool uci::parse_command(const std::string& input) {
	std::istringstream instream(input);
	std::string cmd;
	bool running = true;

	while (instream >> std::skipws >> cmd) {
		std::transform(cmd.begin(), cmd.end(), cmd.begin(), ::tolower);

		if (cmd == "position" && instream >> cmd) {

			std::string tmp;
			if (cmd == "startpos") {
				getline(instream, tmp);
				std::istringstream fen(START_FEN);
				uci_pos.setup(fen);
				load_position(tmp);
			}
			else {
				std::string sfen = "";
				while ((instream >> cmd) && cmd != "moves") sfen += cmd + " ";
				getline(instream, tmp);
				tmp = "moves " + tmp;
				std::istringstream fen(sfen);
				uci_pos.setup(fen);
				load_position(tmp);
			}
		}
		else if (cmd == "setoption" && instream >> cmd && instream >> cmd)
		{
			if (cmd == "hash" && instream >> cmd && instream >> cmd)
			{
				auto sz = atoi(cmd.c_str());
				opts->set("hashsize", sz);
				ttable.resize(sz);
				break;
			}
			if (cmd == "clear" && instream >> cmd)
			{
				if (cmd == "hash")
					ttable.clear();
			}
			if (cmd == "threads" && instream >> cmd && instream >> cmd)
			{
				opts->set("threads", atoi(cmd.c_str()));
				break;
			}
			if (cmd == "multipv" && instream >> cmd && instream >> cmd)
			{
				opts->set("multipv", atoi(cmd.c_str()));
				break;
			}
		}
		else if (cmd == "d") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "fen: " << uci_pos.to_fen() << std::endl;
		}
		else if (cmd == "eval") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "evaluation: " << eval::evaluate(uci_pos, *SearchThreads[0], -1) << std::endl;
		}
		else if (cmd == "undo") {
			uci_pos.undo_move(dbgmove);
		}
		else if (cmd == "fdepth" && instream >> cmd) {
			uci_pos.params.fixed_depth = atoi(cmd.c_str());
			std::cout << "fixed depth search: " << uci_pos.params.fixed_depth << std::endl;
		}

		else if (cmd == "see" && instream >> cmd) {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			Move move;


			for (int i = 0; i < mvs.size(); ++i) {

				if (!uci_pos.is_legal(mvs[i])) continue;

				if (move_to_string(mvs[i]) == cmd) {
					move = mvs[i];
					break;
				}

			}

			if (move.type != Movetype::no_type) {
				int score = uci_pos.see_move(move);
				std::cout << "See score:  " << score << std::endl;
			}
			else std::cout << " (dbg) See : error, illegal move." << std::endl;
		}
		//else if (cmd == "evaltune") {
		//	auto& tm = haVoc::Tuningmanager::instance();
		//	tm.tune_evaluation();
		//}
		else if (cmd == "domove" && instream >> cmd) {
			Movegen mvs(uci_pos);
			bool isok = false;
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) continue;
				std::string tmp = SanSquares[mvs[i].f] + SanSquares[mvs[i].t];
				std::string ps = "";
				Movetype t = Movetype(mvs[i].type);

				if (t >= 0 && t < capture_promotion_q) {
					ps = (t == 0 ? "q" :
						t == 1 ? "r" :
						t == 2 ? "b" : "n");
				}
				else if (t >= capture_promotion_q && t < castle_ks) {
					ps = (t == 4 ? "q" :
						t == 5 ? "r" :
						t == 6 ? "b" : "n");
				}
				tmp += ps;

				if (tmp == cmd) {
					dbgmove.set(mvs[i].f, mvs[i].t, Movetype(mvs[i].type));
					isok = true;
					break;
				}
			}
			if (isok) {
				std::cout << "doing mv " << std::endl;
				uci_pos.do_move(dbgmove);
			}
			else std::cout << cmd << " is not a legal move" << std::endl;
		}
		else if (cmd == "debug") {
			uci_pos.debug_search = !uci_pos.debug_search;
			std::cout << "debugging set to: " << uci_pos.debug_search << std::endl;
		}

		// game specific uci commands (refactor?)
		else if (cmd == "isready") {
			ttable.clear();
			std::cout << "readyok" << std::endl;
		}
		else if (!Search::searching && cmd == "go") {
			limits lims;
			memset(&lims, 0, sizeof(limits));

			while (instream >> cmd)
			{
				if (cmd == "wtime" && instream >> cmd) lims.wtime = atoi(cmd.c_str());
				else if (cmd == "btime" && instream >> cmd) lims.btime = atoi(cmd.c_str());
				else if (cmd == "winc" && instream >> cmd) lims.winc = atoi(cmd.c_str());
				else if (cmd == "binc" && instream >> cmd) lims.binc = atoi(cmd.c_str());
				else if (cmd == "movestogo" && instream >> cmd) lims.movestogo = atoi(cmd.c_str());
				else if (cmd == "nodes" && instream >> cmd) lims.nodes = atoi(cmd.c_str());
				else if (cmd == "movetime" && instream >> cmd) lims.movetime = atoi(cmd.c_str());
				else if (cmd == "mate" && instream >> cmd) lims.mate = atoi(cmd.c_str());
				else if (cmd == "depth" && instream >> cmd) lims.depth = atoi(cmd.c_str());
				else if (cmd == "infinite") lims.infinite = (cmd == "infinite" ? true : false);
				else if (cmd == "ponder") lims.ponder = atoi(cmd.c_str());
			}

			// Set search threads
			int numThreads = std::max(opts->value<int>("threads"), 1);
			if (numThreads != SearchThreads.num_workers())
				SearchThreads.init(numThreads);

			bool silent = false;
			worker.enqueue(Search::start, uci_pos, lims, silent);
		}
		else if (cmd == "stop") {
			UCI_SIGNALS.stop = true;
		}
		else if (cmd == "moves") {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) 
					continue;
				std::cout << move_to_string(mvs[i]) << " ";
			}
			std::cout << std::endl;
		}
		else if (cmd == "ucinewgame") {
			ttable.clear();
			uci_pos.clear();
		}
		else if (cmd == "uci") {
			ttable.clear();
			uci_pos.clear();
			std::cout << "id name haVoc" << std::endl;
			std::cout << "id author M.Glatzmaier" << std::endl;
			std::cout << "option name Threads type spin default 1 min 1 max 1024" << std::endl;
			std::cout << "option name Hash type spin default 1024 min 1 max 33554432" << std::endl;
			std::cout << "option name MultiPV type spin default 1 min 1 max 4" << std::endl;
			std::cout << "uciok" << std::endl;
		}

		else if (cmd == "exit" || cmd == "quit") {
			running = false;
			break;
		}
		else std::cout << "unknown command: " << cmd << std::endl;

	}
	return running;
}